

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O2

void __thiscall wasm::AlignmentLowering::visitLoad(AlignmentLowering *this,Load *curr)

{
  ulong uVar1;
  Type type;
  Address offset;
  address64_t aVar2;
  address64_t aVar3;
  BasicType BVar4;
  Index index;
  Memory *pMVar5;
  LocalSet *left;
  LocalGet *pLVar6;
  Load *pLVar7;
  Expression *pEVar8;
  Unary *left_00;
  Unary *left_01;
  Const *right;
  Binary *right_00;
  Binary *right_01;
  Block *value;
  UnaryOp op;
  optional<wasm::Type> type_00;
  Builder local_38;
  Builder builder;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id == 1) {
    Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                ).
                super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                .
                super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
               ,curr->ptr);
    return;
  }
  uVar1 = (curr->align).addr;
  if (uVar1 == 0) {
    return;
  }
  if (uVar1 == curr->bytes) {
    return;
  }
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
       ).super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       currModule;
  BVar4 = wasm::Type::getBasic
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.
                      type);
  if (3 < BVar4 - i32) {
    handle_unreachable("unhandled unaligned load",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                       ,0x103);
  }
  switch(BVar4) {
  case i32:
    value = (Block *)lowerLoadI32(this,curr);
    break;
  case i64:
    if (curr->bytes != '\b') {
      (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
      op = curr->signed_ ^ ExtendUInt32;
      pEVar8 = lowerLoadI32(this,curr);
      goto LAB_0096107f;
    }
  case f64:
    pMVar5 = Module::getMemory((this->
                               super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                               ).
                               super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .
                               super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .currModule,(Name)(curr->memory).super_IString.str);
    type.id = (pMVar5->addressType).id;
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .currFunction,type);
    left = Builder::makeLocalSet(&local_38,index,curr->ptr);
    offset.addr = (curr->offset).addr;
    aVar2 = (curr->align).addr;
    pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar6->index = index;
    (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id;
    pLVar7 = Builder::makeLoad(&local_38,4,false,offset,(uint)aVar2,(Expression *)pLVar6,(Type)0x2,
                               (Name)(curr->memory).super_IString.str);
    pEVar8 = lowerLoadI32(this,pLVar7);
    left_00 = Builder::makeUnary(&local_38,ExtendUInt32,pEVar8);
    aVar2 = (curr->offset).addr;
    aVar3 = (curr->align).addr;
    pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar6->index = index;
    (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id;
    pLVar7 = Builder::makeLoad(&local_38,4,false,(Address)(aVar2 + 4),(uint)aVar3,
                               (Expression *)pLVar6,(Type)0x2,(Name)(curr->memory).super_IString.str
                              );
    pEVar8 = lowerLoadI32(this,pLVar7);
    left_01 = Builder::makeUnary(&local_38,ExtendUInt32,pEVar8);
    right = Builder::makeConst<long>(&local_38,0x20);
    right_00 = Builder::makeBinary(&local_38,ShlInt64,(Expression *)left_01,(Expression *)right);
    right_01 = Builder::makeBinary(&local_38,OrInt64,(Expression *)left_00,(Expression *)right_00);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)right_00;
    value = Builder::makeSequence(&local_38,(Expression *)left,(Expression *)right_01,type_00);
    if (BVar4 == f64) {
      value = (Block *)Builder::makeUnary(&local_38,ReinterpretInt64,(Expression *)value);
    }
    break;
  case f32:
    (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    pEVar8 = lowerLoadI32(this,curr);
    op = ReinterpretInt32;
LAB_0096107f:
    value = (Block *)Builder::makeUnary(&local_38,op,pEVar8);
  }
  Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
              ).
              super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
              .super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>,
             (Expression *)value);
  return;
}

Assistant:

void visitLoad(Load* curr) {
    // If unreachable, just remove the load, which removes the unaligned
    // operation in a trivial way.
    if (curr->type == Type::unreachable) {
      replaceCurrent(curr->ptr);
      return;
    }
    if (curr->align == 0 || curr->align == curr->bytes) {
      // Nothing to do: leave the node unchanged. All code lower down assumes
      // the operation is unaligned.
      return;
    }
    Builder builder(*getModule());
    auto type = curr->type.getBasic();
    Expression* replacement;
    switch (type) {
      default:
        WASM_UNREACHABLE("unhandled unaligned load");
      case Type::i32:
        replacement = lowerLoadI32(curr);
        break;
      case Type::f32:
        curr->type = Type::i32;
        replacement = builder.makeUnary(ReinterpretInt32, lowerLoadI32(curr));
        break;
      case Type::i64:
      case Type::f64:
        if (type == Type::i64 && curr->bytes != 8) {
          // A load of <64 bits.
          curr->type = Type::i32;
          replacement = builder.makeUnary(
            curr->signed_ ? ExtendSInt32 : ExtendUInt32, lowerLoadI32(curr));
          break;
        }
        // Load two 32-bit pieces, and combine them.
        auto mem = getModule()->getMemory(curr->memory);
        auto addressType = mem->addressType;
        auto temp = builder.addVar(getFunction(), addressType);
        auto* set = builder.makeLocalSet(temp, curr->ptr);
        Expression* low =
          lowerLoadI32(builder.makeLoad(4,
                                        false,
                                        curr->offset,
                                        curr->align,
                                        builder.makeLocalGet(temp, addressType),
                                        Type::i32,
                                        curr->memory));
        low = builder.makeUnary(ExtendUInt32, low);
        // Note that the alignment is assumed to be the same here, even though
        // we add an offset of 4. That is because this is an unaligned load, so
        // the alignment is 1, 2, or 4, which means it stays the same after
        // adding 4.
        Expression* high =
          lowerLoadI32(builder.makeLoad(4,
                                        false,
                                        curr->offset + 4,
                                        curr->align,
                                        builder.makeLocalGet(temp, addressType),
                                        Type::i32,
                                        curr->memory));
        high = builder.makeUnary(ExtendUInt32, high);
        high =
          builder.makeBinary(ShlInt64, high, builder.makeConst(int64_t(32)));
        auto* combined = builder.makeBinary(OrInt64, low, high);
        replacement = builder.makeSequence(set, combined);
        // Ensure the proper output type.
        if (type == Type::f64) {
          replacement = builder.makeUnary(ReinterpretInt64, replacement);
        }
        break;
    }
    replaceCurrent(replacement);
  }